

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void luaG_errormsg(lua_State *L)

{
  StkId pTVar1;
  StkId pTVar2;
  Value *pVVar3;
  TValue *o1_1;
  TValue *o2_1;
  TValue *o1;
  TValue *o2;
  StkId errfunc;
  lua_State *L_local;
  
  if (L->errfunc != 0) {
    pVVar3 = (Value *)((long)&L->stack->value + L->errfunc);
    if (pVVar3[1].b != 6) {
      luaD_throw(L,5);
    }
    pTVar1 = L->top;
    pTVar2 = L->top;
    pTVar2->value = pTVar1[-1].value;
    pTVar2->tt = pTVar1[-1].tt;
    pTVar1 = L->top;
    pTVar1[-1].value = *pVVar3;
    pTVar1[-1].tt = pVVar3[1].b;
    if ((long)L->stack_last - (long)L->top < 0x11) {
      luaD_growstack(L,1);
    }
    L->top = L->top + 1;
    luaD_call(L,L->top + -2,1);
  }
  luaD_throw(L,2);
  return;
}

Assistant:

static void luaG_errormsg(lua_State*L){
if(L->errfunc!=0){
StkId errfunc=restorestack(L,L->errfunc);
if(!ttisfunction(errfunc))luaD_throw(L,5);
setobj(L,L->top,L->top-1);
setobj(L,L->top-1,errfunc);
incr_top(L);
luaD_call(L,L->top-2,1);
}
luaD_throw(L,2);
}